

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_double_add_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *S,
                      mbedtls_ecp_point *P,mbedtls_ecp_point *Q,mbedtls_mpi *d)

{
  int iVar1;
  bool bVar2;
  undefined1 local_118 [8];
  mbedtls_mpi CB;
  mbedtls_mpi DA;
  mbedtls_mpi D;
  mbedtls_mpi C;
  mbedtls_mpi E;
  mbedtls_mpi BB;
  mbedtls_mpi B;
  mbedtls_mpi AA;
  mbedtls_mpi A;
  int ret;
  mbedtls_mpi *d_local;
  mbedtls_ecp_point *Q_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_point *S_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&AA.p);
  mbedtls_mpi_init((mbedtls_mpi *)&B.p);
  mbedtls_mpi_init((mbedtls_mpi *)&BB.p);
  mbedtls_mpi_init((mbedtls_mpi *)&E.p);
  mbedtls_mpi_init((mbedtls_mpi *)&C.p);
  mbedtls_mpi_init((mbedtls_mpi *)&D.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DA.p);
  mbedtls_mpi_init((mbedtls_mpi *)&CB.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_118);
  A.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&AA.p,&P->X,&P->Z);
  while (A.p._4_4_ == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&AA.p,&grp->P);
    if (iVar1 < 0) {
      A.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&B.p,(mbedtls_mpi *)&AA.p,(mbedtls_mpi *)&AA.p)
      ;
      if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp((mbedtls_mpi *)&B.p,grp), A.p._4_4_ == 0)) {
        mul_count = mul_count + 1;
        A.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&BB.p,&P->X,&P->Z);
        goto joined_r0x0012da19;
      }
      break;
    }
    A.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&AA.p,(mbedtls_mpi *)&AA.p,&grp->P);
  }
LAB_0012e0b4:
  mbedtls_mpi_free((mbedtls_mpi *)&AA.p);
  mbedtls_mpi_free((mbedtls_mpi *)&B.p);
  mbedtls_mpi_free((mbedtls_mpi *)&BB.p);
  mbedtls_mpi_free((mbedtls_mpi *)&E.p);
  mbedtls_mpi_free((mbedtls_mpi *)&C.p);
  mbedtls_mpi_free((mbedtls_mpi *)&D.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DA.p);
  mbedtls_mpi_free((mbedtls_mpi *)&CB.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_118);
  return A.p._4_4_;
joined_r0x0012da19:
  if (A.p._4_4_ != 0) goto LAB_0012e0b4;
  bVar2 = false;
  if ((int)BB.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&BB.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    A.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&E.p,(mbedtls_mpi *)&BB.p,(mbedtls_mpi *)&BB.p);
    if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp((mbedtls_mpi *)&E.p,grp), A.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      A.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&C.p,(mbedtls_mpi *)&B.p,(mbedtls_mpi *)&E.p);
      goto joined_r0x0012daf6;
    }
    goto LAB_0012e0b4;
  }
  A.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&BB.p,(mbedtls_mpi *)&BB.p,&grp->P);
  goto joined_r0x0012da19;
joined_r0x0012daf6:
  if (A.p._4_4_ != 0) goto LAB_0012e0b4;
  bVar2 = false;
  if ((int)C.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&C.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    A.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&D.p,&Q->X,&Q->Z);
    goto joined_r0x0012db84;
  }
  A.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&C.p,(mbedtls_mpi *)&C.p,&grp->P);
  goto joined_r0x0012daf6;
joined_r0x0012db84:
  if (A.p._4_4_ != 0) goto LAB_0012e0b4;
  iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&D.p,&grp->P);
  if (iVar1 < 0) {
    A.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&DA.p,&Q->X,&Q->Z);
    goto joined_r0x0012dbf2;
  }
  A.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&D.p,(mbedtls_mpi *)&D.p,&grp->P);
  goto joined_r0x0012db84;
joined_r0x0012dbf2:
  if (A.p._4_4_ != 0) goto LAB_0012e0b4;
  bVar2 = false;
  if ((int)DA.p < 0) {
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&DA.p,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    A.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&CB.p,(mbedtls_mpi *)&DA.p,(mbedtls_mpi *)&AA.p);
    if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp((mbedtls_mpi *)&CB.p,grp), A.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      A.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_118,(mbedtls_mpi *)&D.p,
                                      (mbedtls_mpi *)&BB.p);
      if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp((mbedtls_mpi *)local_118,grp), A.p._4_4_ == 0))
      {
        mul_count = mul_count + 1;
        A.p._4_4_ = mbedtls_mpi_add_mpi(&S->X,(mbedtls_mpi *)&CB.p,(mbedtls_mpi *)local_118);
        if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp(&S->X,grp), A.p._4_4_ == 0)) {
          mul_count = mul_count + 1;
          A.p._4_4_ = mbedtls_mpi_mul_mpi(&S->X,&S->X,&S->X);
          if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp(&S->X,grp), A.p._4_4_ == 0)) {
            mul_count = mul_count + 1;
            A.p._4_4_ = mbedtls_mpi_sub_mpi(&S->Z,(mbedtls_mpi *)&CB.p,(mbedtls_mpi *)local_118);
            goto joined_r0x0012ddeb;
          }
        }
      }
    }
    goto LAB_0012e0b4;
  }
  A.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&DA.p,(mbedtls_mpi *)&DA.p,&grp->P);
  goto joined_r0x0012dbf2;
joined_r0x0012ddeb:
  if (A.p._4_4_ != 0) goto LAB_0012e0b4;
  bVar2 = false;
  if ((S->Z).s < 0) {
    iVar1 = mbedtls_mpi_cmp_int(&S->Z,0);
    bVar2 = iVar1 != 0;
  }
  if (!bVar2) {
    A.p._4_4_ = mbedtls_mpi_mul_mpi(&S->Z,&S->Z,&S->Z);
    if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp(&S->Z,grp), A.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
      A.p._4_4_ = mbedtls_mpi_mul_mpi(&S->Z,d,&S->Z);
      if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp(&S->Z,grp), A.p._4_4_ == 0)) {
        mul_count = mul_count + 1;
        A.p._4_4_ = mbedtls_mpi_mul_mpi(&R->X,(mbedtls_mpi *)&B.p,(mbedtls_mpi *)&E.p);
        if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp(&R->X,grp), A.p._4_4_ == 0)) {
          mul_count = mul_count + 1;
          A.p._4_4_ = mbedtls_mpi_mul_mpi(&R->Z,&grp->A,(mbedtls_mpi *)&C.p);
          if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp(&R->Z,grp), A.p._4_4_ == 0)) {
            mul_count = mul_count + 1;
            A.p._4_4_ = mbedtls_mpi_add_mpi(&R->Z,(mbedtls_mpi *)&E.p,&R->Z);
            goto joined_r0x0012e003;
          }
        }
      }
    }
    goto LAB_0012e0b4;
  }
  A.p._4_4_ = mbedtls_mpi_add_mpi(&S->Z,&S->Z,&grp->P);
  goto joined_r0x0012ddeb;
joined_r0x0012e003:
  if (A.p._4_4_ != 0) goto LAB_0012e0b4;
  iVar1 = mbedtls_mpi_cmp_mpi(&R->Z,&grp->P);
  if (iVar1 < 0) {
    A.p._4_4_ = mbedtls_mpi_mul_mpi(&R->Z,(mbedtls_mpi *)&C.p,&R->Z);
    if ((A.p._4_4_ == 0) && (A.p._4_4_ = ecp_modp(&R->Z,grp), A.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
    }
    goto LAB_0012e0b4;
  }
  A.p._4_4_ = mbedtls_mpi_sub_abs(&R->Z,&R->Z,&grp->P);
  goto joined_r0x0012e003;
}

Assistant:

static int ecp_double_add_mxz( const mbedtls_ecp_group *grp,
                               mbedtls_ecp_point *R, mbedtls_ecp_point *S,
                               const mbedtls_ecp_point *P, const mbedtls_ecp_point *Q,
                               const mbedtls_mpi *d )
{
    int ret;
    mbedtls_mpi A, AA, B, BB, E, C, D, DA, CB;

    mbedtls_mpi_init( &A ); mbedtls_mpi_init( &AA ); mbedtls_mpi_init( &B );
    mbedtls_mpi_init( &BB ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &C );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &DA ); mbedtls_mpi_init( &CB );

    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &A,    &P->X,   &P->Z ) ); MOD_ADD( A    );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &AA,   &A,      &A    ) ); MOD_MUL( AA   );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &B,    &P->X,   &P->Z ) ); MOD_SUB( B    );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &BB,   &B,      &B    ) ); MOD_MUL( BB   );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &E,    &AA,     &BB   ) ); MOD_SUB( E    );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &C,    &Q->X,   &Q->Z ) ); MOD_ADD( C    );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &D,    &Q->X,   &Q->Z ) ); MOD_SUB( D    );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &DA,   &D,      &A    ) ); MOD_MUL( DA   );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &CB,   &C,      &B    ) ); MOD_MUL( CB   );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &S->X, &DA,     &CB   ) ); MOD_MUL( S->X );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S->X, &S->X,   &S->X ) ); MOD_MUL( S->X );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &S->Z, &DA,     &CB   ) ); MOD_SUB( S->Z );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S->Z, &S->Z,   &S->Z ) ); MOD_MUL( S->Z );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S->Z, d,       &S->Z ) ); MOD_MUL( S->Z );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &R->X, &AA,     &BB   ) ); MOD_MUL( R->X );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &R->Z, &grp->A, &E    ) ); MOD_MUL( R->Z );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &R->Z, &BB,     &R->Z ) ); MOD_ADD( R->Z );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &R->Z, &E,      &R->Z ) ); MOD_MUL( R->Z );

cleanup:
    mbedtls_mpi_free( &A ); mbedtls_mpi_free( &AA ); mbedtls_mpi_free( &B );
    mbedtls_mpi_free( &BB ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &C );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &DA ); mbedtls_mpi_free( &CB );

    return( ret );
}